

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priminfo_mb.h
# Opt level: O3

PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *
embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2
          (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *a,
          PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *b)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  BBox1f BVar8;
  size_t sVar9;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *r;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *in_RDI;
  uint uVar10;
  uint uVar11;
  float fVar12;
  float fVar14;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  float fVar15;
  float fVar16;
  
  aVar13 = (a->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.field_0;
  aVar1 = (a->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.field_0;
  aVar2 = (a->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.field_0;
  aVar3 = (a->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.field_0;
  aVar4 = (a->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0;
  aVar5 = (a->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0;
  BVar8 = a->time_range;
  in_RDI->max_time_range = a->max_time_range;
  in_RDI->time_range = BVar8;
  sVar9 = a->max_num_time_segments;
  in_RDI->num_time_segments = a->num_time_segments;
  in_RDI->max_num_time_segments = sVar9;
  aVar13.m128 = (__m128)minps(aVar13.m128,
                              (b->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0
                              .lower.field_0);
  (in_RDI->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.field_0 = aVar13
  ;
  aVar13.m128 = (__m128)maxps(aVar1.m128,
                              (b->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0
                              .upper.field_0);
  (in_RDI->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.field_0 = aVar13
  ;
  aVar13.m128 = (__m128)minps(aVar2.m128,
                              (b->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1
                              .lower.field_0);
  (in_RDI->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.field_0 = aVar13
  ;
  aVar13.m128 = (__m128)maxps(aVar3.m128,
                              (b->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1
                              .upper.field_0);
  (in_RDI->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.field_0 = aVar13
  ;
  aVar13.m128 = (__m128)minps(aVar4.m128,
                              (b->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
                              field_0);
  (in_RDI->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0 = aVar13;
  aVar13.m128 = (__m128)maxps(aVar5.m128,
                              (b->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
                              field_0);
  (in_RDI->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0 = aVar13;
  fVar12 = (in_RDI->time_range).lower;
  fVar14 = (in_RDI->time_range).upper;
  fVar15 = (b->time_range).lower;
  fVar16 = (b->time_range).upper;
  uVar10 = -(uint)(fVar12 < fVar15);
  uVar11 = -(uint)(fVar14 < fVar16);
  in_RDI->time_range =
       (BBox1f)(CONCAT44(~uVar11 & (uint)fVar14,~uVar10 & (uint)fVar15) |
               CONCAT44((uint)fVar16 & uVar11,(uint)fVar12 & uVar10));
  uVar6 = (b->object_range)._end;
  uVar7 = (a->object_range)._end;
  (in_RDI->object_range)._begin = (b->object_range)._begin + (a->object_range)._begin;
  (in_RDI->object_range)._end = uVar6 + uVar7;
  in_RDI->num_time_segments = in_RDI->num_time_segments + b->num_time_segments;
  if (in_RDI->max_num_time_segments < b->max_num_time_segments) {
    in_RDI->max_num_time_segments = b->max_num_time_segments;
    in_RDI->max_time_range = b->max_time_range;
  }
  return in_RDI;
}

Assistant:

static __forceinline const PrimInfoMBT merge2(const PrimInfoMBT& a, const PrimInfoMBT& b) {
        PrimInfoMBT r = a; r.merge(b); return r;
      }